

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall common_log::add(common_log *this,ggml_log_level level,char *fmt,__va_list_tag *args)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  int64_t iVar4;
  vector<char,_std::allocator<char>_> *this_00;
  reference this_01;
  vector<common_log_entry,_std::allocator<common_log_entry>_> *__x;
  size_type sVar5;
  undefined8 *in_RCX;
  char *in_RDX;
  ggml_log_level in_ESI;
  long in_RDI;
  size_t i;
  size_t new_tail;
  vector<common_log_entry,_std::allocator<common_log_entry>_> new_entries;
  size_t n;
  va_list args_copy;
  value_type *entry;
  lock_guard<std::mutex> lock;
  common_log_entry *in_stack_ffffffffffffff08;
  lock_guard<std::mutex> *in_stack_ffffffffffffff10;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff28;
  undefined1 *__n;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  size_type local_a0;
  size_type local_98;
  undefined1 local_89;
  vector<common_log_entry,_std::allocator<common_log_entry>_> local_88;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  reference local_38;
  undefined4 local_2c;
  undefined8 *local_20;
  char *local_18;
  ggml_log_level local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff10,(mutex_type *)in_stack_ffffffffffffff08);
  if ((*(byte *)(in_RDI + 0x6a) & 1) == 0) {
    local_2c = 1;
  }
  else {
    local_38 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::operator[]
                         ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)
                          (in_RDI + 0x78),*(size_type *)(in_RDI + 0x98));
    local_48 = local_20[2];
    local_58 = *local_20;
    uStack_50 = local_20[1];
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x3b480a);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_38->msg);
    iVar1 = vsnprintf(pcVar2,sVar3,local_18,local_20);
    local_60 = (long)iVar1;
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_38->msg);
    if (sVar3 <= (ulong)(long)iVar1) {
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x3b48a1);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_38->msg);
      vsnprintf(pcVar2,sVar3,local_18,&local_58);
    }
    local_38->level = local_c;
    local_38->prefix = (bool)(*(byte *)(in_RDI + 0x68) & 1);
    local_38->timestamp = 0;
    if ((*(byte *)(in_RDI + 0x69) & 1) != 0) {
      iVar4 = t_us();
      local_38->timestamp = iVar4 - *(long *)(in_RDI + 0x70);
    }
    local_38->is_end = false;
    this_00 = (vector<char,_std::allocator<char>_> *)(*(long *)(in_RDI + 0x98) + 1);
    sVar3 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::size
                      ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)
                       (in_RDI + 0x78));
    *(ulong *)(in_RDI + 0x98) = (ulong)this_00 % sVar3;
    if (*(long *)(in_RDI + 0x98) == *(long *)(in_RDI + 0x90)) {
      sVar3 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::size
                        ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)
                         (in_RDI + 0x78));
      __a = (allocator_type *)(sVar3 * 2);
      __n = &local_89;
      std::allocator<common_log_entry>::allocator((allocator<common_log_entry> *)0x3b49d6);
      std::vector<common_log_entry,_std::allocator<common_log_entry>_>::vector
                ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)this_00,
                 (size_type)__n,__a);
      std::allocator<common_log_entry>::~allocator((allocator<common_log_entry> *)0x3b49f6);
      local_98 = 0;
      do {
        this_01 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::operator[]
                            ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)
                             (in_RDI + 0x78),*(size_type *)(in_RDI + 0x90));
        std::vector<common_log_entry,_std::allocator<common_log_entry>_>::operator[]
                  (&local_88,local_98);
        common_log_entry::operator=(this_01,in_stack_ffffffffffffff08);
        __x = (vector<common_log_entry,_std::allocator<common_log_entry>_> *)
              (*(long *)(in_RDI + 0x90) + 1);
        sVar3 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::size
                          ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)
                           (in_RDI + 0x78));
        *(ulong *)(in_RDI + 0x90) = (ulong)__x % sVar3;
        local_98 = local_98 + 1;
      } while (*(long *)(in_RDI + 0x90) != *(long *)(in_RDI + 0x98));
      *(undefined8 *)(in_RDI + 0x90) = 0;
      *(size_type *)(in_RDI + 0x98) = local_98;
      local_a0 = *(size_type *)(in_RDI + 0x98);
      while( true ) {
        sVar3 = local_a0;
        sVar5 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::size(&local_88);
        if (sVar5 <= sVar3) break;
        std::vector<common_log_entry,_std::allocator<common_log_entry>_>::operator[]
                  (&local_88,local_a0);
        std::vector<char,_std::allocator<char>_>::resize(this_00,(size_type)__n);
        local_a0 = local_a0 + 1;
      }
      std::vector<common_log_entry,_std::allocator<common_log_entry>_>::operator=
                ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)__a,__x);
      std::vector<common_log_entry,_std::allocator<common_log_entry>_>::~vector
                ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)__a);
    }
    std::condition_variable::notify_one();
    local_2c = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x3b4b94);
  return;
}

Assistant:

void add(enum ggml_log_level level, const char * fmt, va_list args) {
        std::lock_guard<std::mutex> lock(mtx);

        if (!running) {
            // discard messages while the worker thread is paused
            return;
        }

        auto & entry = entries[tail];

        {
            // cannot use args twice, so make a copy in case we need to expand the buffer
            va_list args_copy;
            va_copy(args_copy, args);

#if 1
            const size_t n = vsnprintf(entry.msg.data(), entry.msg.size(), fmt, args);
            if (n >= entry.msg.size()) {
                entry.msg.resize(n + 1);
                vsnprintf(entry.msg.data(), entry.msg.size(), fmt, args_copy);
            }
#else
            // hack for bolding arguments

            std::stringstream ss;
            for (int i = 0; fmt[i] != 0; i++) {
                if (fmt[i] == '%') {
                    ss << LOG_COL_BOLD;
                    while (fmt[i] != ' ' && fmt[i] != ')' && fmt[i] != ']' && fmt[i] != 0) ss << fmt[i++];
                    ss << LOG_COL_DEFAULT;
                    if (fmt[i] == 0) break;
                }
                ss << fmt[i];
            }
            const size_t n = vsnprintf(entry.msg.data(), entry.msg.size(), ss.str().c_str(), args);
            if (n >= entry.msg.size()) {
                entry.msg.resize(n + 1);
                vsnprintf(entry.msg.data(), entry.msg.size(), ss.str().c_str(), args_copy);
            }
#endif
            va_end(args_copy);
        }

        entry.level = level;
        entry.prefix = prefix;
        entry.timestamp = 0;
        if (timestamps) {
            entry.timestamp = t_us() - t_start;
        }
        entry.is_end = false;

        tail = (tail + 1) % entries.size();
        if (tail == head) {
            // expand the buffer
            std::vector<common_log_entry> new_entries(2*entries.size());

            size_t new_tail = 0;

            do {
                new_entries[new_tail] = std::move(entries[head]);

                head     = (head     + 1) % entries.size();
                new_tail = (new_tail + 1);
            } while (head != tail);

            head = 0;
            tail = new_tail;

            for (size_t i = tail; i < new_entries.size(); i++) {
                new_entries[i].msg.resize(256);
            }

            entries = std::move(new_entries);
        }

        cv.notify_one();
    }